

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeField
                    (FieldDescriptor *field,Message *message,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  int *piVar1;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar2;
  byte bVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  CppStringType CVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint8_t *puVar12;
  MapFieldBase *this;
  RepeatedField<double> *rhs;
  uint64_t uVar13;
  long lVar14;
  EnumValueDescriptor *pEVar15;
  MessageLite *pMVar16;
  string *psVar17;
  RepeatedField<int> *pRVar18;
  RepeatedField<unsigned_int> *pRVar19;
  RepeatedField<long> *pRVar20;
  size_t sVar21;
  RepeatedField<float> *rhs_00;
  RepeatedField<unsigned_long> *pRVar22;
  RepeatedField<bool> *rhs_01;
  int *piVar23;
  anon_union_8_2_4f9aec01_for_ShortSooRep_1 *paVar24;
  ulong uVar25;
  ulong uVar26;
  string *psVar27;
  byte *pbVar28;
  string *extraout_RAX;
  bool bVar29;
  uint uVar30;
  Reflection *this_00;
  Descriptor *pDVar31;
  long lVar32;
  char *in_R9;
  float fVar33;
  double dVar34;
  Metadata MVar35;
  string_view field_name;
  MapValueConstRef map_value;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  undefined1 local_100 [32];
  void *local_e0;
  long local_d0 [2];
  int local_c0;
  undefined1 local_a8 [32];
  KeyValue local_88;
  CppType local_68;
  MapValueConstRef local_60;
  long local_48;
  Descriptor *local_40;
  ulong local_38;
  
  MVar35 = Message::GetMetadata(message);
  this_00 = MVar35.reflection;
  bVar3 = field->field_0x1;
  if ((((bVar3 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    bVar29 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar29) {
      psVar27 = (string *)0x0;
    }
    else {
      psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                          (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar27 == (string *)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        puVar12 = InternalSerializeMessageSetItem(field,message,target,stream);
        return puVar12;
      }
      goto LAB_00333112;
    }
    InternalSerializeField();
switchD_003333f0_caseD_9:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
               ,0x539);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_a8,(char (*) [19])"Invalid descriptor");
LAB_003359dc:
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8)
    ;
  }
LAB_00333112:
  if ((field->type_ == '\v') && (bVar29 = FieldDescriptor::is_map_message_type(field), bVar29)) {
    this = Reflection::GetMapData(this_00,message,field);
    bVar29 = MapFieldBase::IsMapValid(this);
    local_38 = CONCAT71(local_38._1_7_,bVar29);
    if (bVar29) {
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_a8,message,this_00,field);
        if (local_a8._0_8_ != local_a8._8_8_) {
          pDVar31 = (Descriptor *)local_a8._0_8_;
          do {
            local_100._0_8_ = 0;
            local_100._8_4_ = 0;
            Reflection::LookupMapValue
                      (this_00,message,field,(MapKey *)pDVar31,
                       (MapValueConstRef *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
            target = InternalSerializeMapEntry
                               (field,(MapKey *)pDVar31,
                                (MapValueConstRef *)
                                &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                                target,stream);
            pDVar31 = (Descriptor *)&pDVar31->proto_features_;
          } while (pDVar31 != (Descriptor *)local_a8._8_8_);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_a8);
      }
      else {
        Reflection::MapBegin((MapIterator *)local_a8,this_00,message,field);
        while( true ) {
          Reflection::MapEnd((MapIterator *)
                             &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,this_00
                             ,message,field);
          bVar29 = MapFieldBase::EqualIterator
                             ((MapFieldBase *)local_a8._24_8_,(MapIterator *)local_a8,
                              (MapIterator *)
                              &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
          if ((local_c0 == 9) && ((long *)local_e0 != local_d0)) {
            operator_delete(local_e0,local_d0[0] + 1);
          }
          if (bVar29) break;
          target = InternalSerializeMapEntry
                             (field,(MapKey *)&local_88.string_value,&local_60,target,stream);
          MapFieldBase::IncreaseIterator((MapFieldBase *)local_a8._24_8_,(MapIterator *)local_a8);
        }
        if ((local_68 == CPPTYPE_STRING) &&
           (local_88._0_8_ != (undefined1 *)((long)&local_88.string_value.union_ + 0x10))) {
          operator_delete((void *)local_88.int64_value,local_88._16_8_ + 1);
        }
      }
    }
    if ((char)local_38 != '\0') {
      return target;
    }
  }
  bVar3 = field->field_0x1;
  bVar29 = (bool)((bVar3 & 0x20) >> 5);
  if (0xbf < bVar3 == bVar29) {
    psVar27 = (string *)0x0;
  }
  else {
    psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                        (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar27 != (string *)0x0) {
    InternalSerializeField();
    psVar27 = extraout_RAX;
LAB_00335a86:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
               ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
    goto LAB_003359dc;
  }
  if ((field->field_0x1 & 0x20) == 0) {
    uVar6 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar29 = Reflection::HasField(this_00,message,field);
      uVar6 = (uint)bVar29;
    }
  }
  else {
    uVar6 = Reflection::FieldSize(this_00,message,field);
  }
  if (((int)uVar6 < 2) || (field->type_ != '\v')) {
LAB_00333391:
    pDVar31 = (Descriptor *)0x0;
    local_40 = (Descriptor *)0x0;
    local_48 = 0;
  }
  else {
    local_48._0_4_ = 0;
    local_48._4_4_ = (atomic<unsigned_int>)0x0;
    bVar29 = FieldDescriptor::is_map_message_type(field);
    if ((!bVar29) || (stream->is_serialization_deterministic_ != true)) goto LAB_00333391;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_a8,message,uVar6,this_00,field);
    local_40 = (Descriptor *)local_a8._8_8_;
    local_48 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
    pDVar31 = (Descriptor *)local_a8._0_8_;
  }
  bVar29 = FieldDescriptor::is_packed(field);
  if (!bVar29) {
    if (0 < (int)uVar6) {
      local_38 = (ulong)uVar6;
      lVar32 = 0;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        iVar11 = (int)lVar32;
        switch(field->type_) {
        case '\x01':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              dVar34 = Reflection::GetDouble(this_00,message,field);
            }
            else {
              dVar34 = Reflection::GetRepeatedDouble(this_00,message,field,iVar11);
            }
            uVar26 = (ulong)(field->number_ * 8 + 1);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar6 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar6);
            }
            *target = (byte)uVar26;
            *(double *)(target + 1) = dVar34;
            goto LAB_00333dba;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x02':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              fVar33 = Reflection::GetFloat(this_00,message,field);
            }
            else {
              fVar33 = Reflection::GetRepeatedFloat(this_00,message,field,iVar11);
            }
            uVar26 = (ulong)(field->number_ * 8 + 5);
            if (0x7f < (uint)(field->number_ << 3)) {
              do {
                uVar6 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar6);
            }
            *target = (byte)uVar26;
            *(float *)(target + 1) = fVar33;
            goto LAB_00333e44;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x03':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar25 = Reflection::GetInt64(this_00,message,field);
            }
            else {
              uVar25 = Reflection::GetRepeatedInt64(this_00,message,field,iVar11);
            }
            uVar10 = field->number_ << 3;
            uVar6 = uVar10;
            if (0x7f < uVar10) {
              do {
                *target = (byte)uVar6 | 0x80;
                uVar10 = uVar6 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar10;
              } while (bVar29);
            }
            *target = (byte)uVar10;
            pbVar28 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar25) {
              do {
                *pbVar28 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar29);
            }
            goto LAB_00333e02;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x04':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar25 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar25 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar11);
            }
            uVar10 = field->number_ << 3;
            uVar6 = uVar10;
            if (0x7f < uVar10) {
              do {
                *target = (byte)uVar6 | 0x80;
                uVar10 = uVar6 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar10;
              } while (bVar29);
            }
            *target = (byte)uVar10;
            pbVar28 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar25) {
              do {
                *pbVar28 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar29);
            }
            goto LAB_00333e02;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x05':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar6 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              uVar6 = Reflection::GetRepeatedInt32(this_00,message,field,iVar11);
            }
            uVar30 = field->number_ << 3;
            uVar10 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar10 | 0x80;
                uVar30 = uVar10 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar10;
                uVar10 = uVar30;
              } while (bVar29);
            }
            *target = (byte)uVar30;
            pbVar28 = target + 1;
            uVar25 = (ulong)(int)uVar6;
            uVar26 = uVar25;
            if (0x7f < uVar6) {
              do {
                *pbVar28 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar29);
            }
            *pbVar28 = (byte)uVar25;
            goto LAB_00333e06;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x06':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar13 = Reflection::GetUInt64(this_00,message,field);
            }
            else {
              uVar13 = Reflection::GetRepeatedUInt64(this_00,message,field,iVar11);
            }
            uVar6 = field->number_ * 8 + 1;
            uVar26 = (ulong)uVar6;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00333daf:
              uVar26 = (ulong)uVar6;
            }
            else {
              do {
                uVar6 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar6);
            }
            goto LAB_00333db1;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\a':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar7 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar7 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar11);
            }
            uVar6 = field->number_ * 8 + 5;
            uVar26 = (ulong)uVar6;
            if ((uint)(field->number_ << 3) < 0x80) {
LAB_00333e39:
              uVar26 = (ulong)uVar6;
            }
            else {
              do {
                uVar6 = (uint)uVar26;
                *target = (byte)uVar26 | 0x80;
                uVar26 = uVar26 >> 7;
                target = target + 1;
              } while (0x3fff < uVar6);
            }
            goto LAB_00333e3b;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\b':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_003359dc;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            bVar29 = Reflection::GetBool(this_00,message,field);
          }
          else {
            bVar29 = Reflection::GetRepeatedBool(this_00,message,field,iVar11);
          }
          uVar10 = field->number_ << 3;
          uVar6 = uVar10;
          if (0x7f < uVar10) {
            do {
              *target = (byte)uVar6 | 0x80;
              uVar10 = uVar6 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar6;
              uVar6 = uVar10;
            } while (bVar5);
          }
          *target = (byte)uVar10;
          target[1] = bVar29;
          target = target + 2;
          break;
        case '\t':
          FieldDescriptor::requires_utf8_validation(field);
          local_a8._0_8_ = local_a8 + 0x10;
          local_a8._8_8_ = (Descriptor *)0x0;
          local_a8[0x10] = '\0';
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_100,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
LAB_00335ce5:
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)
                       &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
          }
          if ((field->field_0x1 & 0x20) == 0) {
            psVar17 = Reflection::GetStringReference(this_00,message,field,(string *)local_a8);
          }
          else {
            psVar17 = Reflection::GetRepeatedStringReference
                                (this_00,message,field,iVar11,(string *)local_a8);
          }
          field_name._M_str = in_R9;
          field_name._M_len = (size_t)field->all_names_[1]._M_dataplus._M_p;
          WireFormatLite::VerifyUtf8String
                    ((WireFormatLite *)(psVar17->_M_dataplus)._M_p,
                     (char *)(ulong)(uint)psVar17->_M_string_length,1,
                     (Operation)field->all_names_[1]._M_string_length,field_name);
          sVar4 = psVar17->_M_string_length;
          if ((long)sVar4 < 0x80) {
            uVar6 = field->number_ * 8;
            lVar14 = 1;
            if (((0x7f < uVar6) && (lVar14 = 2, 0x3fff < uVar6)) && (lVar14 = 3, 0x1fffff < uVar6))
            {
              lVar14 = 5 - (ulong)(uVar6 < 0x10000000);
            }
            if ((long)(stream->end_ + ~(ulong)(target + lVar14) + 0x10) < (long)sVar4)
            goto LAB_003340cb;
            uVar30 = uVar6 | 2;
            uVar10 = uVar30;
            if (0x7f < uVar6) {
              do {
                *target = (byte)uVar10 | 0x80;
                uVar30 = uVar10 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar10;
                uVar10 = uVar30;
              } while (bVar29);
            }
            *target = (byte)uVar30;
            target[1] = (byte)sVar4;
            memcpy(target + 2,(psVar17->_M_dataplus)._M_p,sVar4);
            target = target + sVar4 + 2;
          }
          else {
LAB_003340cb:
            target = io::EpsCopyOutputStream::WriteStringOutline
                               (stream,field->number_,psVar17,target);
          }
          if ((Descriptor *)local_a8._0_8_ != (Descriptor *)(local_a8 + 0x10)) {
LAB_00334028:
            operator_delete((void *)local_a8._0_8_,CONCAT71(local_a8._17_7_,local_a8[0x10]) + 1);
          }
          break;
        case '\n':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_003359dc;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            pMVar16 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pDVar31 == local_40) {
            pMVar16 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar11)->
                       super_MessageLite;
          }
          else {
            pMVar16 = *(MessageLite **)((long)&pDVar31->super_SymbolBase + lVar32 * 8);
          }
          target = WireFormatLite::InternalWriteGroup(field->number_,pMVar16,target,stream);
          break;
        case '\v':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_003359dc;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            pMVar16 = &Reflection::GetMessage(this_00,message,field,(MessageFactory *)0x0)->
                       super_MessageLite;
          }
          else if (pDVar31 == local_40) {
            pMVar16 = &Reflection::GetRepeatedMessage(this_00,message,field,iVar11)->
                       super_MessageLite;
          }
          else {
            pMVar16 = *(MessageLite **)((long)&pDVar31->super_SymbolBase + lVar32 * 8);
          }
          iVar11 = field->number_;
          iVar9 = MessageLite::GetCachedSize(pMVar16);
          target = WireFormatLite::InternalWriteMessage(iVar11,pMVar16,iVar9,target,stream);
          break;
        case '\f':
          CVar8 = FieldDescriptor::cpp_string_type(field);
          if (CVar8 == kCord) {
            Reflection::GetCord((Reflection *)local_a8,(Message *)this_00,(FieldDescriptor *)message
                               );
            target = io::EpsCopyOutputStream::WriteString
                               (stream,field->number_,(Cord *)local_a8,target);
            absl::lts_20240722::Cord::~Cord((Cord *)local_a8);
          }
          else {
            local_a8._0_8_ = local_a8 + 0x10;
            local_a8._8_8_ = (Descriptor *)0x0;
            local_a8[0x10] = '\0';
            bVar3 = field->field_0x1;
            bVar29 = (bool)((bVar3 & 0x20) >> 5);
            if (0xbf < bVar3 == bVar29) {
              psVar27 = (string *)0x0;
            }
            else {
              psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
            }
            if (psVar27 != (string *)0x0) {
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_100,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                         ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
              goto LAB_00335ce5;
            }
            if ((field->field_0x1 & 0x20) == 0) {
              psVar17 = Reflection::GetStringReference(this_00,message,field,(string *)local_a8);
            }
            else {
              psVar17 = Reflection::GetRepeatedStringReference
                                  (this_00,message,field,iVar11,(string *)local_a8);
            }
            sVar4 = psVar17->_M_string_length;
            if ((long)sVar4 < 0x80) {
              uVar6 = field->number_ * 8;
              lVar14 = 1;
              if (((0x7f < uVar6) && (lVar14 = 2, 0x3fff < uVar6)) && (lVar14 = 3, 0x1fffff < uVar6)
                 ) {
                lVar14 = 5 - (ulong)(uVar6 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(target + lVar14) + 0x10) < (long)sVar4)
              goto LAB_003344f7;
              uVar30 = uVar6 | 2;
              uVar10 = uVar30;
              if (0x7f < uVar6) {
                do {
                  *target = (byte)uVar10 | 0x80;
                  uVar30 = uVar10 >> 7;
                  target = target + 1;
                  bVar29 = 0x3fff < uVar10;
                  uVar10 = uVar30;
                } while (bVar29);
              }
              *target = (byte)uVar30;
              target[1] = (byte)sVar4;
              memcpy(target + 2,(psVar17->_M_dataplus)._M_p,sVar4);
              target = target + sVar4 + 2;
            }
            else {
LAB_003344f7:
              target = io::EpsCopyOutputStream::WriteStringOutline
                                 (stream,field->number_,psVar17,target);
            }
            if ((Descriptor *)local_a8._0_8_ != (Descriptor *)(local_a8 + 0x10)) goto LAB_00334028;
          }
          break;
        case '\r':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              uVar10 = Reflection::GetUInt32(this_00,message,field);
            }
            else {
              uVar10 = Reflection::GetRepeatedUInt32(this_00,message,field,iVar11);
            }
            uVar30 = field->number_ << 3;
            uVar6 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar6 | 0x80;
                uVar30 = uVar6 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar30;
              } while (bVar29);
            }
            *target = (byte)uVar30;
            pbVar28 = target + 1;
            uVar6 = uVar10;
            if (0x7f < uVar10) {
              do {
                *pbVar28 = (byte)uVar6 | 0x80;
                uVar10 = uVar6 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar10;
              } while (bVar29);
            }
            goto LAB_00333b43;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x0e':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              pEVar15 = Reflection::GetEnum(this_00,message,field);
            }
            else {
              pEVar15 = Reflection::GetRepeatedEnum(this_00,message,field,iVar11);
            }
            uVar6 = pEVar15->number_;
            uVar25 = (ulong)(int)uVar6;
            uVar30 = field->number_ << 3;
            uVar10 = uVar30;
            if (0x7f < uVar30) {
              do {
                *target = (byte)uVar10 | 0x80;
                uVar30 = uVar10 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar10;
                uVar10 = uVar30;
              } while (bVar29);
            }
            *target = (byte)uVar30;
            pbVar28 = target + 1;
            uVar26 = uVar25;
            if (0x7f < uVar6) {
              do {
                *pbVar28 = (byte)uVar26 | 0x80;
                uVar25 = uVar26 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar26;
                uVar26 = uVar25;
              } while (bVar29);
            }
            goto LAB_00333e02;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x0f':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_003359dc;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            uVar7 = Reflection::GetInt32(this_00,message,field);
          }
          else {
            uVar7 = Reflection::GetRepeatedInt32(this_00,message,field,iVar11);
          }
          uVar6 = field->number_ * 8 + 5;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00333e39;
          uVar26 = (ulong)uVar6;
          do {
            uVar6 = (uint)uVar26;
            *target = (byte)uVar26 | 0x80;
            uVar26 = uVar26 >> 7;
            target = target + 1;
          } while (0x3fff < uVar6);
LAB_00333e3b:
          *target = (byte)uVar26;
          *(uint32_t *)(target + 1) = uVar7;
LAB_00333e44:
          target = target + 5;
          break;
        case '\x10':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
            goto LAB_003359dc;
          }
          if ((field->field_0x1 & 0x20) == 0) {
            uVar13 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            uVar13 = Reflection::GetRepeatedInt64(this_00,message,field,iVar11);
          }
          uVar6 = field->number_ * 8 + 1;
          if ((uint)(field->number_ << 3) < 0x80) goto LAB_00333daf;
          uVar26 = (ulong)uVar6;
          do {
            uVar6 = (uint)uVar26;
            *target = (byte)uVar26 | 0x80;
            uVar26 = uVar26 >> 7;
            target = target + 1;
          } while (0x3fff < uVar6);
LAB_00333db1:
          *target = (byte)uVar26;
          *(uint64_t *)(target + 1) = uVar13;
LAB_00333dba:
          target = target + 9;
          break;
        case '\x11':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 == (string *)0x0) {
            if ((field->field_0x1 & 0x20) == 0) {
              iVar11 = Reflection::GetInt32(this_00,message,field);
            }
            else {
              iVar11 = Reflection::GetRepeatedInt32(this_00,message,field,iVar11);
            }
            uVar10 = field->number_ << 3;
            uVar6 = uVar10;
            if (0x7f < uVar10) {
              do {
                *target = (byte)uVar6 | 0x80;
                uVar10 = uVar6 >> 7;
                target = target + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar10;
              } while (bVar29);
            }
            *target = (byte)uVar10;
            pbVar28 = target + 1;
            uVar10 = iVar11 >> 0x1f ^ iVar11 * 2;
            uVar6 = uVar10;
            if (0x7f < uVar10) {
              do {
                *pbVar28 = (byte)uVar6 | 0x80;
                uVar10 = uVar6 >> 7;
                pbVar28 = pbVar28 + 1;
                bVar29 = 0x3fff < uVar6;
                uVar6 = uVar10;
              } while (bVar29);
            }
LAB_00333b43:
            *pbVar28 = (byte)uVar10;
            goto LAB_00333e06;
          }
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar27 + 8),*(undefined8 *)psVar27);
          goto LAB_003359dc;
        case '\x12':
          bVar3 = field->field_0x1;
          bVar29 = (bool)((bVar3 & 0x20) >> 5);
          if (0xbf < bVar3 == bVar29) {
            psVar27 = (string *)0x0;
          }
          else {
            psVar27 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar29,0xbf < bVar3,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar27 != (string *)0x0) goto LAB_00335a86;
          if ((field->field_0x1 & 0x20) == 0) {
            lVar14 = Reflection::GetInt64(this_00,message,field);
          }
          else {
            lVar14 = Reflection::GetRepeatedInt64(this_00,message,field,iVar11);
          }
          uVar10 = field->number_ << 3;
          uVar6 = uVar10;
          if (0x7f < uVar10) {
            do {
              *target = (byte)uVar6 | 0x80;
              uVar10 = uVar6 >> 7;
              target = target + 1;
              bVar29 = 0x3fff < uVar6;
              uVar6 = uVar10;
            } while (bVar29);
          }
          *target = (byte)uVar10;
          pbVar28 = target + 1;
          uVar25 = lVar14 >> 0x3f ^ lVar14 * 2;
          uVar26 = uVar25;
          if (0x7f < uVar25) {
            do {
              *pbVar28 = (byte)uVar26 | 0x80;
              uVar25 = uVar26 >> 7;
              pbVar28 = pbVar28 + 1;
              bVar29 = 0x3fff < uVar26;
              uVar26 = uVar25;
            } while (bVar29);
          }
LAB_00333e02:
          *pbVar28 = (byte)uVar25;
LAB_00333e06:
          target = pbVar28 + 1;
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != local_38);
    }
    goto LAB_00335262;
  }
  if (uVar6 == 0) goto LAB_00335262;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  switch(field->type_) {
  case '\x01':
    rhs = Reflection::GetRepeatedFieldInternal<double>(this_00,message,field);
    RepeatedField<double>::RepeatedField
              ((RepeatedField<double> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,rhs);
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (target < stream->end_) {
      uVar6 = iVar9 << 3;
      uVar26 = (ulong)(iVar11 * 8 + 2);
      if (0x7f < (uint)(iVar11 << 3)) {
        do {
          uVar10 = (uint)uVar26;
          *target = (byte)uVar26 | 0x80;
          uVar26 = uVar26 >> 7;
          target = target + 1;
        } while (0x3fff < uVar10);
      }
      *target = (byte)uVar26;
      pbVar28 = target + 1;
      uVar10 = uVar6;
      uVar30 = uVar6;
      if (0x7f < uVar6) {
        do {
          target = pbVar28;
          *target = (byte)uVar30 | 0x80;
          uVar10 = uVar30 >> 7;
          pbVar28 = target + 1;
          bVar29 = 0x3fff < uVar30;
          uVar30 = uVar10;
        } while (bVar29);
      }
      *pbVar28 = (byte)uVar10;
      if ((local_100._0_8_ & 4) == 0) {
        piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
      }
      else {
        piVar23 = (int *)LongSooRep::elements
                                   (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep)
        ;
      }
      pbVar28 = target + 2;
      if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
        target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
      }
      else {
        memcpy(pbVar28,piVar23,(ulong)uVar6);
        target = pbVar28 + (int)uVar6;
      }
      RepeatedField<double>::~RepeatedField
                ((RepeatedField<double> *)
                 &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
      goto LAB_00335262;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
               ,0x355,10,"ptr < end_");
    goto LAB_003359dc;
  case '\x02':
    rhs_00 = Reflection::GetRepeatedFieldInternal<float>(this_00,message,field);
    RepeatedField<float>::RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,rhs_00);
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar6 = iVar9 << 2;
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
    RepeatedField<float>::~RepeatedField
              ((RepeatedField<float> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    goto LAB_00335262;
  case '\x03':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar20)
    ;
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements
                          (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar24 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar26 = *(ulong *)paVar24->data;
      uVar25 = uVar26;
      if (0x7f < uVar26) {
        do {
          *target = (byte)uVar25 | 0x80;
          uVar26 = uVar25 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar25;
          uVar25 = uVar26;
        } while (bVar29);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar26;
      target = target + 1;
    } while (paVar24 < paVar2);
    goto LAB_00334d44;
  case '\x04':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar22)
    ;
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements
                          (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar24 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar26 = *(ulong *)paVar24->data;
      uVar25 = uVar26;
      if (0x7f < uVar26) {
        do {
          *target = (byte)uVar25 | 0x80;
          uVar26 = uVar25 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar25;
          uVar25 = uVar26;
        } while (bVar29);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar26;
      target = target + 1;
    } while (paVar24 < paVar2);
    goto LAB_00335093;
  case '\x05':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep
               ,(Arena *)0x0,pRVar18);
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar23 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = (ulong)*piVar23;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar29);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (piVar23 < piVar1);
    break;
  case '\x06':
    pRVar22 = Reflection::GetRepeatedFieldInternal<unsigned_long>(this_00,message,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar22)
    ;
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar6 = iVar9 << 3;
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
LAB_00335093:
    RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    goto LAB_00335262;
  case '\a':
    pRVar19 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar19)
    ;
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar6 = iVar9 << 2;
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
    goto LAB_00335255;
  case '\b':
    rhs_01 = Reflection::GetRepeatedFieldInternal<bool>(this_00,message,field);
    RepeatedField<bool>::RepeatedField
              ((RepeatedField<bool> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,rhs_01);
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
    RepeatedField<bool>::~RepeatedField
              ((RepeatedField<bool> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    goto LAB_00335262;
  default:
    goto switchD_003333f0_caseD_9;
  case '\r':
    pRVar19 = Reflection::GetRepeatedFieldInternal<unsigned_int>(this_00,message,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar19)
    ;
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar23 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = *piVar23;
      uVar10 = uVar6;
      if (0x7f < uVar6) {
        do {
          *target = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar29);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar6;
      target = target + 1;
    } while (piVar23 < piVar1);
LAB_00335255:
    RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    goto LAB_00335262;
  case '\x0e':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep
               ,(Arena *)0x0,pRVar18);
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar23 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = (ulong)*piVar23;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar29);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (piVar23 < piVar1);
    break;
  case '\x0f':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep
               ,(Arena *)0x0,pRVar18);
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar6 = iVar9 << 2;
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
    break;
  case '\x10':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar20)
    ;
    iVar11 = field->number_;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                         (local_100._0_8_ & 4) == 0);
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar6 = iVar9 << 3;
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar10 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar10);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    uVar10 = uVar6;
    uVar30 = uVar6;
    if (0x7f < uVar6) {
      do {
        target = pbVar28;
        *target = (byte)uVar30 | 0x80;
        uVar10 = uVar30 >> 7;
        pbVar28 = target + 1;
        bVar29 = 0x3fff < uVar30;
        uVar30 = uVar10;
      } while (bVar29);
    }
    *pbVar28 = (byte)uVar10;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    pbVar28 = target + 2;
    if ((long)stream->end_ - (long)pbVar28 < (long)(int)uVar6) {
      target = io::EpsCopyOutputStream::WriteRawFallback(stream,piVar23,uVar6,pbVar28);
    }
    else {
      memcpy(pbVar28,piVar23,(ulong)uVar6);
      target = pbVar28 + (int)uVar6;
    }
    goto LAB_00334d44;
  case '\x11':
    pRVar18 = Reflection::GetRepeatedFieldInternal<int>(this_00,message,field);
    RepeatedField<int>::RepeatedField
              ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep
               ,(Arena *)0x0,pRVar18);
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      piVar23 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep).size;
    }
    else {
      piVar23 = (int *)LongSooRep::elements
                                 (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    piVar1 = piVar23 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar10 = *piVar23 >> 0x1f ^ *piVar23 * 2;
      uVar6 = uVar10;
      if (0x7f < uVar10) {
        do {
          *target = (byte)uVar6 | 0x80;
          uVar10 = uVar6 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar6;
          uVar6 = uVar10;
        } while (bVar29);
      }
      piVar23 = piVar23 + 1;
      *target = (byte)uVar10;
      target = target + 1;
    } while (piVar23 < piVar1);
    break;
  case '\x12':
    pRVar20 = Reflection::GetRepeatedFieldInternal<long>(this_00,message,field);
    RepeatedField<long>::RepeatedField
              ((RepeatedField<long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,(Arena *)0x0,pRVar20)
    ;
    iVar11 = field->number_;
    sVar21 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.h"
                 ,0x355,10,"ptr < end_");
      goto LAB_003359dc;
    }
    uVar26 = (ulong)(iVar11 * 8 + 2);
    if (0x7f < (uint)(iVar11 << 3)) {
      do {
        uVar6 = (uint)uVar26;
        *target = (byte)uVar26 | 0x80;
        uVar26 = uVar26 >> 7;
        target = target + 1;
      } while (0x3fff < uVar6);
    }
    *target = (byte)uVar26;
    pbVar28 = target + 1;
    if (0x7f < (uint)sVar21) {
      do {
        target = pbVar28;
        uVar6 = (uint)sVar21;
        *target = (byte)sVar21 | 0x80;
        sVar21 = (size_t)(uVar6 >> 7);
        pbVar28 = target + 1;
      } while (0x3fff < uVar6);
    }
    *pbVar28 = (byte)sVar21;
    if ((local_100._0_8_ & 4) == 0) {
      paVar24 = &(((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->short_rep).field_1;
    }
    else {
      paVar24 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1 *)
                LongSooRep::elements
                          (&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    }
    iVar11 = SooRep::size((SooRep *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep,
                          (local_100._0_8_ & 4) == 0);
    target = target + 2;
    paVar2 = paVar24 + iVar11;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar25 = *(long *)paVar24->data >> 0x3f ^ *(long *)paVar24->data * 2;
      uVar26 = uVar25;
      if (0x7f < uVar25) {
        do {
          *target = (byte)uVar26 | 0x80;
          uVar25 = uVar26 >> 7;
          target = target + 1;
          bVar29 = 0x3fff < uVar26;
          uVar26 = uVar25;
        } while (bVar29);
      }
      paVar24 = paVar24 + 1;
      *target = (byte)uVar25;
      target = target + 1;
    } while (paVar24 < paVar2);
LAB_00334d44:
    RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)
               &((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
    goto LAB_00335262;
  }
  RepeatedField<int>::~RepeatedField
            ((RepeatedField<int> *)&((anon_union_16_2_b9f6da03_for_SooRep_0 *)local_100)->long_rep);
LAB_00335262:
  if (pDVar31 != (Descriptor *)0x0) {
    operator_delete(pDVar31,local_48 - (long)pDVar31);
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                            const Message& message,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }


  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueConstRef map_value;
          message_reflection->LookupMapValue(message, field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                               \
        field->number(), r, FieldDataOnlyByteSize(field, message), target);    \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    auto r =                                                                   \
        message_reflection->GetRepeatedFieldInternal<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);             \
    break;                                                                     \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        ABSL_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  auto get_message_from_field = [&message, &map_entries, message_reflection](
                                    const FieldDescriptor* field, int j) {
    if (!field->is_repeated()) {
      return &message_reflection->GetMessage(message, field);
    }
    if (!map_entries.empty()) {
      return map_entries[j];
    }
    return &message_reflection->GetRepeatedMessage(message, field, j);
  };
  for (int j = 0; j < count; j++) {
    target = stream->EnsureSpace(target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32_t, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64_t, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32_t, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64_t, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32_t, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64_t, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32_t, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64_t, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32_t, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64_t, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

      case FieldDescriptor::TYPE_GROUP: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteGroup(field->number(), *msg,
                                                    target, stream);
      } break;

      case FieldDescriptor::TYPE_MESSAGE: {
        auto* msg = get_message_from_field(field, j);
        target = WireFormatLite::InternalWriteMessage(
            field->number(), *msg, msg->GetCachedSize(), target, stream);
      } break;

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = field->requires_utf8_validation();
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          absl::Cord value = message_reflection->GetCord(message, field);
          target = stream->WriteString(field->number(), value, target);
          break;
        }
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}